

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O0

bool __thiscall
base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Add
          (HookList<void_(*)(const_void_*,_unsigned_long)> *this,
          _func_void_void_ptr_unsigned_long *value)

{
  ulong uVar1;
  atomic<void_(*)(const_void_*,_unsigned_long)> *paVar2;
  __pointer_type p_Var3;
  bool bVar4;
  uintptr_t prev_num_hooks;
  int local_64;
  int index;
  SpinLockHolder l;
  _func_void_void_ptr_unsigned_long *value_local;
  HookList<void_(*)(const_void_*,_unsigned_long)> *this_local;
  memory_order __b;
  memory_order __b_1;
  
  if (value == (_func_void_void_ptr_unsigned_long *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    l.lock_ = (SpinLock *)value;
    SpinLockHolder::SpinLockHolder
              ((SpinLockHolder *)&stack0xffffffffffffffa0,(SpinLock *)&hooklist_spinlock);
    local_64 = 0;
    while( true ) {
      bVar4 = false;
      if (local_64 < 7) {
        paVar2 = cast_priv_data(this,local_64);
        p_Var3 = std::atomic<void_(*)(const_void_*,_unsigned_long)>::load
                           (paVar2,memory_order_relaxed);
        bVar4 = p_Var3 != (__pointer_type)0x0;
      }
      if (!bVar4) break;
      local_64 = local_64 + 1;
    }
    if (local_64 == 7) {
      this_local._7_1_ = false;
    }
    else {
      std::operator&(memory_order_acquire,__memory_order_mask);
      uVar1 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
      paVar2 = cast_priv_data(this,local_64);
      std::atomic<void_(*)(const_void_*,_unsigned_long)>::store
                (paVar2,(__pointer_type)l.lock_,memory_order_relaxed);
      if (uVar1 <= (ulong)(long)local_64) {
        std::operator&(memory_order_relaxed,__memory_order_mask);
        (this->priv_end).super___atomic_base<unsigned_long>._M_i = (long)(local_64 + 1);
      }
      this_local._7_1_ = true;
    }
    SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&stack0xffffffffffffffa0);
  }
  return this_local._7_1_;
}

Assistant:

bool HookList<T>::Add(T value) {
  if (value == T{}) {
    return false;
  }
  SpinLockHolder l(&hooklist_spinlock);
  // Find the first slot in data that is 0.
  int index = 0;
  while ((index < kHookListMaxValues) &&
         cast_priv_data(index)->load(std::memory_order_relaxed) != T{}) {
    ++index;
  }
  if (index == kHookListMaxValues) {
    return false;
  }
  uintptr_t prev_num_hooks = priv_end.load(std::memory_order_acquire);
  cast_priv_data(index)->store(value, std::memory_order_relaxed);
  if (prev_num_hooks <= index) {
    priv_end.store(index + 1, std::memory_order_relaxed);
  }
  return true;
}